

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# traversal_algorithm.cpp
# Opt level: O0

void __thiscall
libtorrent::dht::traversal_algorithm::finished(traversal_algorithm *this,observer_ptr *o)

{
  bool bVar1;
  element_type *peVar2;
  bitfield_flag local_19;
  bool is_done;
  observer_ptr *poStack_18;
  observer_ptr *o_local;
  traversal_algorithm *this_local;
  
  poStack_18 = o;
  o_local = (observer_ptr *)this;
  peVar2 = ::std::
           __shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)o);
  local_19 = (bitfield_flag)
             libtorrent::flags::operator&
                       ((bitfield_flag<unsigned_char,_libtorrent::dht::observer_flags_tag,_void>)
                        (peVar2->flags).m_val,
                        (bitfield_flag<unsigned_char,_libtorrent::dht::observer_flags_tag,_void>)0x8
                       );
  bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_19);
  if (bVar1) {
    this->m_branch_factor = this->m_branch_factor + -1;
  }
  peVar2 = ::std::
           __shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)o);
  libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::dht::observer_flags_tag,_void>::
  operator|=(&peVar2->flags,
             (bitfield_flag<unsigned_char,_libtorrent::dht::observer_flags_tag,_void>)0x40);
  this->m_responses = this->m_responses + 1;
  this->m_invoke_count = this->m_invoke_count + -1;
  bVar1 = add_requests(this);
  if (bVar1) {
    (*this->_vptr_traversal_algorithm[4])();
  }
  return;
}

Assistant:

void traversal_algorithm::finished(observer_ptr o)
{
#if TORRENT_USE_ASSERTS
	auto i = std::find(m_results.begin(), m_results.end(), o);
	TORRENT_ASSERT(i != m_results.end());
#endif

	// if this flag is set, it means we increased the
	// branch factor for it, and we should restore it
	if (o->flags & observer::flag_short_timeout)
	{
		TORRENT_ASSERT(m_branch_factor > 0);
		--m_branch_factor;
	}

	TORRENT_ASSERT((o->flags & (observer::flag_queried
		| observer::flag_alive
		| observer::flag_failed
		)) == observer::flag_queried);
	o->flags |= observer::flag_alive;

	++m_responses;
	TORRENT_ASSERT(m_invoke_count > 0);
	--m_invoke_count;
	bool const is_done = add_requests();
	if (is_done) done();
}